

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

void __thiscall OpenMD::ForceField::parse(ForceField *this,string *filename)

{
  value_type pAVar1;
  int iVar2;
  size_type sVar3;
  reference ppAVar4;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *in_RDI;
  AtomType *in_stack_00000008;
  int j;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  AtomType *at;
  MapTypeIterator i;
  ifstrstream *ffStream;
  ForceField *in_stack_000102c0;
  istream *in_stack_000102c8;
  SectionParserManager *in_stack_000102d0;
  MapTypeIterator *in_stack_ffffffffffffffa8;
  TypeContainer<OpenMD::AtomType,_1> *in_stack_ffffffffffffffb0;
  int local_44;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_40;
  ElemPtr local_28;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::AtomType_*>_>_>
  local_20;
  ifstrstream *local_18;
  
  local_18 = openForceFieldFile((ForceField *)at,
                                (string *)
                                ayb.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SectionParserManager::parse(in_stack_000102d0,in_stack_000102c8,in_stack_000102c0);
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::AtomType_*>_>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = TypeContainer<OpenMD::AtomType,_1>::beginType
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  while (local_28 != (ElemPtr)0x0) {
    AtomType::allYourBase(in_stack_00000008);
    sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size(&local_40);
    if (1 < sVar3) {
      sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size(&local_40);
      iVar2 = (int)sVar3;
      while (local_44 = iVar2 + -1, 0 < local_44) {
        ppAVar4 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                            (&local_40,(long)(iVar2 + -2));
        pAVar1 = *ppAVar4;
        ppAVar4 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                            (&local_40,(long)local_44);
        (*pAVar1->_vptr_AtomType[2])(pAVar1,*ppAVar4);
        iVar2 = local_44;
      }
    }
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector(in_RDI);
    local_28 = TypeContainer<OpenMD::AtomType,_1>::nextType
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  if (local_18 != (ifstrstream *)0x0) {
    (*(local_18->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])();
  }
  return;
}

Assistant:

void ForceField::parse(const std::string& filename) {
    ifstrstream* ffStream;

    ffStream = openForceFieldFile(filename);

    spMan_.parse(*ffStream, *this);

    ForceField::AtomTypeContainer::MapTypeIterator i;
    AtomType* at;

    for (at = atomTypeCont_.beginType(i); at != NULL;
         at = atomTypeCont_.nextType(i)) {
      // useBase sets the responsibilities, and these have to be done
      // after the atomTypes and Base types have all been scanned:

      std::vector<AtomType*> ayb = at->allYourBase();
      if (ayb.size() > 1) {
        for (int j = ayb.size() - 1; j > 0; j--) {
          ayb[j - 1]->useBase(ayb[j]);
        }
      }
    }

    delete ffStream;
  }